

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O0

void __thiscall APowerProtection::InitEffect(APowerProtection *this)

{
  bool bVar1;
  AActor *pAVar2;
  undefined1 local_54 [4];
  TFlags<ActorFlag5,_unsigned_int> local_50;
  undefined1 local_4c [4];
  TFlags<ActorFlag5,_unsigned_int> local_48;
  TFlags<ActorFlag5,_unsigned_int> local_44;
  undefined1 local_40 [4];
  TFlags<ActorFlag3,_unsigned_int> local_3c;
  TFlags<ActorFlag3,_unsigned_int> local_38;
  TFlags<ActorFlag3,_unsigned_int> local_34;
  TFlags<ActorFlag3,_unsigned_int> local_30;
  undefined1 local_2c [4];
  TFlags<ActorFlag3,_unsigned_int> local_28;
  TFlags<ActorFlag3,_unsigned_int> local_24;
  TFlags<ActorFlag3,_unsigned_int> local_20;
  TFlags<ActorFlag3,_unsigned_int> local_1c;
  TFlags<ActorFlag3,_unsigned_int> local_18;
  FSoundID local_14;
  APowerProtection *local_10;
  APowerProtection *this_local;
  
  local_10 = this;
  APowerup::InitEffect(&this->super_APowerup);
  bVar1 = TObjPtr<AActor>::operator!=(&(this->super_APowerup).super_AInventory.Owner,(AActor *)0x0);
  if (bVar1) {
    pAVar2 = ::TObjPtr::operator_cast_to_AActor_
                       ((TObjPtr *)&(this->super_APowerup).super_AInventory.Owner);
    FSoundID::FSoundID(&local_14,
                       &(this->super_APowerup).super_AInventory.super_AActor.SeeSound.super_FSoundID
                      );
    S_Sound(pAVar2,0,&local_14,1.0,0.0);
    pAVar2 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
    ::operator|((EnumType)local_2c,MF3_NORADIUSDMG);
    TFlags<ActorFlag3,_unsigned_int>::operator|(&local_28,(ActorFlag3)local_2c);
    TFlags<ActorFlag3,_unsigned_int>::operator|(&local_24,(ActorFlag3)&local_28);
    TFlags<ActorFlag3,_unsigned_int>::operator|(&local_20,(ActorFlag3)&local_24);
    TFlags<ActorFlag3,_unsigned_int>::operator&(&local_1c,&pAVar2->flags3);
    TFlags<ActorFlag3,_unsigned_int>::operator~(&local_18);
    TFlags<ActorFlag3,_unsigned_int>::operator&=
              (&(this->super_APowerup).super_AInventory.super_AActor.flags3,&local_18);
    ::operator|((EnumType)local_40,MF3_NORADIUSDMG);
    TFlags<ActorFlag3,_unsigned_int>::operator|(&local_3c,(ActorFlag3)local_40);
    TFlags<ActorFlag3,_unsigned_int>::operator|(&local_38,(ActorFlag3)&local_3c);
    TFlags<ActorFlag3,_unsigned_int>::operator|(&local_34,(ActorFlag3)&local_38);
    TFlags<ActorFlag3,_unsigned_int>::operator&
              (&local_30,&(this->super_APowerup).super_AInventory.super_AActor.flags3);
    pAVar2 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
    TFlags<ActorFlag3,_unsigned_int>::operator|=(&pAVar2->flags3,&local_30);
    pAVar2 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
    ::operator|((EnumType)local_4c,MF5_NOPAIN);
    TFlags<ActorFlag5,_unsigned_int>::operator&(&local_48,&pAVar2->flags5);
    TFlags<ActorFlag5,_unsigned_int>::operator~(&local_44);
    TFlags<ActorFlag5,_unsigned_int>::operator&=
              (&(this->super_APowerup).super_AInventory.super_AActor.flags5,&local_44);
    ::operator|((EnumType)local_54,MF5_NOPAIN);
    TFlags<ActorFlag5,_unsigned_int>::operator&
              (&local_50,&(this->super_APowerup).super_AInventory.super_AActor.flags5);
    pAVar2 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
    TFlags<ActorFlag5,_unsigned_int>::operator|=(&pAVar2->flags5,&local_50);
  }
  return;
}

Assistant:

void APowerProtection::InitEffect( )
{
	Super::InitEffect();

	if (Owner != NULL)
	{
		S_Sound(Owner, CHAN_AUTO, SeeSound, 1.0f, ATTN_NONE);

		// Transfer various protection flags if owner does not already have them.
		// If the owner already has the flag, clear it from the powerup.
		// If the powerup still has a flag set, add it to the owner.
		flags3 &= ~(Owner->flags3 & PROTECTION_FLAGS3);
		Owner->flags3 |= flags3 & PROTECTION_FLAGS3;

		flags5 &= ~(Owner->flags5 & PROTECTION_FLAGS5);
		Owner->flags5 |= flags5 & PROTECTION_FLAGS5;
	}
}